

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# That.hpp
# Opt level: O2

void ut11::Assert::That<char[16],ut11::detail::NotOperand<ut11::Operands::IsStringEndingWith>>
               (size_t line,string *file,char (*expected) [16],
               NotOperand<ut11::Operands::IsStringEndingWith> *operand)

{
  bool bVar1;
  string local_60;
  string local_40;
  
  bVar1 = detail::NotOperand<ut11::Operands::IsStringEndingWith>::operator()(operand,expected);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_40,(string *)file);
    detail::NotOperand<ut11::Operands::IsStringEndingWith>::GetErrorMessage<char[16]>
              (&local_60,operand,expected);
    Fail(line,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

inline void That(std::size_t line, std::string file, const Expected& expected, const Operand& operand)
		{
			if ( operand(expected) )
				return;
			Fail(line, file, operand.GetErrorMessage(expected));
		}